

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

String * kj::_::anon_unknown_2::makeDescriptionImpl
                   (String *__return_storage_ptr__,DescriptionStyle style,char *code,int errorNumber
                   ,char *sysErrorString,char *macroArgs,ArrayPtr<kj::String> argValues)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  ExceptionCallback *pEVar4;
  String *pSVar5;
  size_t sVar6;
  size_t sVar7;
  ulong *puVar8;
  bool bVar9;
  long *plVar10;
  char cVar11;
  size_t sVar12;
  String *pSVar13;
  char *pcVar14;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  DescriptionStyle DVar21;
  Array<kj::ArrayPtr<const_char>_> argNames_heap;
  ArrayPtr<const_char> argNames_stack [8];
  char buffer [256];
  undefined7 in_stack_fffffffffffffdf8;
  long local_200;
  String *local_1f8;
  long local_1f0;
  char *local_1e8;
  String *pSStack_1e0;
  undefined8 *local_1d8;
  char *local_1c8;
  String *local_1c0;
  char local_1b8 [128];
  String local_138 [11];
  
  local_1b8[0x70] = '\0';
  local_1b8[0x71] = '\0';
  local_1b8[0x72] = '\0';
  local_1b8[0x73] = '\0';
  local_1b8[0x74] = '\0';
  local_1b8[0x75] = '\0';
  local_1b8[0x76] = '\0';
  local_1b8[0x77] = '\0';
  local_1b8[0x78] = '\0';
  local_1b8[0x79] = '\0';
  local_1b8[0x7a] = '\0';
  local_1b8[0x7b] = '\0';
  local_1b8[0x7c] = '\0';
  local_1b8[0x7d] = '\0';
  local_1b8[0x7e] = '\0';
  local_1b8[0x7f] = '\0';
  local_1b8[0x60] = '\0';
  local_1b8[0x61] = '\0';
  local_1b8[0x62] = '\0';
  local_1b8[99] = '\0';
  local_1b8[100] = '\0';
  local_1b8[0x65] = '\0';
  local_1b8[0x66] = '\0';
  local_1b8[0x67] = '\0';
  local_1b8[0x68] = '\0';
  local_1b8[0x69] = '\0';
  local_1b8[0x6a] = '\0';
  local_1b8[0x6b] = '\0';
  local_1b8[0x6c] = '\0';
  local_1b8[0x6d] = '\0';
  local_1b8[0x6e] = '\0';
  local_1b8[0x6f] = '\0';
  local_1b8[0x50] = '\0';
  local_1b8[0x51] = '\0';
  local_1b8[0x52] = '\0';
  local_1b8[0x53] = '\0';
  local_1b8[0x54] = '\0';
  local_1b8[0x55] = '\0';
  local_1b8[0x56] = '\0';
  local_1b8[0x57] = '\0';
  local_1b8[0x58] = '\0';
  local_1b8[0x59] = '\0';
  local_1b8[0x5a] = '\0';
  local_1b8[0x5b] = '\0';
  local_1b8[0x5c] = '\0';
  local_1b8[0x5d] = '\0';
  local_1b8[0x5e] = '\0';
  local_1b8[0x5f] = '\0';
  local_1b8[0x40] = '\0';
  local_1b8[0x41] = '\0';
  local_1b8[0x42] = '\0';
  local_1b8[0x43] = '\0';
  local_1b8[0x44] = '\0';
  local_1b8[0x45] = '\0';
  local_1b8[0x46] = '\0';
  local_1b8[0x47] = '\0';
  local_1b8[0x48] = '\0';
  local_1b8[0x49] = '\0';
  local_1b8[0x4a] = '\0';
  local_1b8[0x4b] = '\0';
  local_1b8[0x4c] = '\0';
  local_1b8[0x4d] = '\0';
  local_1b8[0x4e] = '\0';
  local_1b8[0x4f] = '\0';
  local_1b8[0x30] = '\0';
  local_1b8[0x31] = '\0';
  local_1b8[0x32] = '\0';
  local_1b8[0x33] = '\0';
  local_1b8[0x34] = '\0';
  local_1b8[0x35] = '\0';
  local_1b8[0x36] = '\0';
  local_1b8[0x37] = '\0';
  local_1b8[0x38] = '\0';
  local_1b8[0x39] = '\0';
  local_1b8[0x3a] = '\0';
  local_1b8[0x3b] = '\0';
  local_1b8[0x3c] = '\0';
  local_1b8[0x3d] = '\0';
  local_1b8[0x3e] = '\0';
  local_1b8[0x3f] = '\0';
  local_1b8[0x20] = '\0';
  local_1b8[0x21] = '\0';
  local_1b8[0x22] = '\0';
  local_1b8[0x23] = '\0';
  local_1b8[0x24] = '\0';
  local_1b8[0x25] = '\0';
  local_1b8[0x26] = '\0';
  local_1b8[0x27] = '\0';
  local_1b8[0x28] = '\0';
  local_1b8[0x29] = '\0';
  local_1b8[0x2a] = '\0';
  local_1b8[0x2b] = '\0';
  local_1b8[0x2c] = '\0';
  local_1b8[0x2d] = '\0';
  local_1b8[0x2e] = '\0';
  local_1b8[0x2f] = '\0';
  local_1b8[0x10] = '\0';
  local_1b8[0x11] = '\0';
  local_1b8[0x12] = '\0';
  local_1b8[0x13] = '\0';
  local_1b8[0x14] = '\0';
  local_1b8[0x15] = '\0';
  local_1b8[0x16] = '\0';
  local_1b8[0x17] = '\0';
  local_1b8[0x18] = '\0';
  local_1b8[0x19] = '\0';
  local_1b8[0x1a] = '\0';
  local_1b8[0x1b] = '\0';
  local_1b8[0x1c] = '\0';
  local_1b8[0x1d] = '\0';
  local_1b8[0x1e] = '\0';
  local_1b8[0x1f] = '\0';
  local_1b8[0] = '\0';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_1b8[4] = '\0';
  local_1b8[5] = '\0';
  local_1b8[6] = '\0';
  local_1b8[7] = '\0';
  local_1b8[8] = '\0';
  local_1b8[9] = '\0';
  local_1b8[10] = '\0';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = '\0';
  local_1b8[0xd] = '\0';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  local_1c8 = sysErrorString;
  if (argValues.ptr < (String *)0x9) {
    local_1e8 = (char *)0x0;
    pSStack_1e0 = (String *)0x0;
    local_1d8 = (undefined8 *)0x0;
    pcVar20 = local_1b8;
    if (argValues.ptr == (String *)0x0) goto LAB_002716c2;
  }
  else {
    pcVar20 = (char *)HeapArrayDisposer::allocateImpl
                                (0x10,(size_t)argValues.ptr,(size_t)argValues.ptr,
                                 HeapArrayDisposer::Allocate_<kj::ArrayPtr<const_char>_>::construct,
                                 ArrayDisposer::Dispose_<kj::ArrayPtr<const_char>_>::destruct);
    pSStack_1e0 = argValues.ptr;
    local_1d8 = &HeapArrayDisposer::instance;
    local_1e8 = pcVar20;
  }
  do {
    pcVar19 = sysErrorString;
    cVar11 = *pcVar19;
    iVar2 = isspace((int)cVar11);
    sysErrorString = pcVar19 + 1;
  } while (iVar2 != 0);
  iVar2 = 0;
  pSVar5 = (String *)0x0;
  if (cVar11 == '\0') {
LAB_002715f8:
    pSVar13 = pSVar5;
    if (pSVar5 < argValues.ptr) {
      pSVar13 = (String *)((long)&(pSVar5->content).ptr + 1);
      *(char **)(pcVar20 + (long)pSVar5 * 0x10) = pcVar19;
      *(char **)(pcVar20 + ((long)pSVar5 * 2 + 1) * 8) = sysErrorString + ~(ulong)pcVar19;
    }
    if (pSVar13 != argValues.ptr) {
      pEVar4 = getExceptionCallback();
      local_1c0 = argValues.ptr;
      str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
                (local_138,(kj *)"Failed to parse logging macro args into ",
                 (char (*) [41])&local_1c0,(unsigned_long *)" names: ",(char (*) [9])&local_1c8,
                 (char **)&stack0xfffffffffffffdff,(char *)CONCAT17(10,in_stack_fffffffffffffdf8));
      (*pEVar4->_vptr_ExceptionCallback[4])
                (pEVar4,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug.c++"
                 ,0xdd,0,local_138);
      sVar12 = local_138[0].content.size_;
      pcVar19 = local_138[0].content.ptr;
      if (local_138[0].content.ptr != (char *)0x0) {
        local_138[0].content.ptr = (char *)0x0;
        local_138[0].content.size_ = 0;
        (*(code *)**(undefined8 **)local_138[0].content.disposer)
                  (local_138[0].content.disposer,pcVar19,1,sVar12,sVar12,0);
      }
    }
LAB_002716c2:
    if (((style == SYSCALL) && (pSVar5 = (String *)strchr(code,0x3d), pSVar5 != (String *)0x0)) &&
       (*(char *)((long)&(pSVar5->content).ptr + 1) != '=')) {
      do {
        code = (char *)((long)&(pSVar5->content).ptr + 1);
        iVar2 = isspace((int)*(char *)((long)&(pSVar5->content).ptr + 1));
        pSVar5 = (String *)code;
      } while (iVar2 != 0);
    }
    DVar21 = LOG;
    if ((String *)code != (String *)0x0) {
      DVar21 = style;
    }
    if (style != ASSERTION) {
      DVar21 = style;
    }
    if (DVar21 == LOG) {
      sVar12 = 0;
      memset(local_138,0,0x100);
      code = "";
      local_1f0 = 1;
      local_200 = 1;
      local_1f8 = (String *)0x2fd09f;
    }
    else {
      sVar6 = strlen(code);
      local_200 = sVar6 + 1;
      sVar12 = 0;
      memset(local_138,0,0x100);
      if (DVar21 == SYSCALL) {
        local_1f8 = (String *)strerror_r(errorNumber,(char *)local_138,0x100);
        sVar7 = strlen((char *)local_1f8);
        sVar12 = sVar7 + sVar6 + 2;
        local_1f0 = sVar7 + 1;
      }
      else {
        local_1f0 = 1;
        local_1f8 = (String *)0x2fd09f;
        if (DVar21 == ASSERTION) {
          sVar12 = sVar6 + 9;
        }
      }
    }
    if (argValues.ptr != (String *)0x0) {
      puVar8 = (ulong *)(pcVar20 + 8);
      plVar10 = (long *)(macroArgs + 8);
      pSVar5 = (String *)0x0;
      do {
        plVar1 = (long *)puVar8[-1];
        uVar17 = *puVar8;
        sVar16 = sVar12;
        if (uVar17 == 0xc) {
          if ((int)plVar1[1] != 0x6e6f6974 || *plVar1 != 0x69646e6f436a6b5f) {
            if (pSVar5 != (String *)0x0) {
              sVar16 = sVar12 + 2;
            }
            if (DVar21 != LOG) {
              sVar16 = sVar12 + 2;
            }
            if ((char)*plVar1 != '\"') {
LAB_0027185b:
              if (*plVar1 != 0x287274733a3a6a6b) goto LAB_0027186a;
            }
            goto LAB_00271871;
          }
          lVar18 = *plVar10;
          if ((lVar18 != 6) ||
             ((short)((int *)plVar10[-1])[1] != 0x65 || *(int *)plVar10[-1] != 0x736c6166)) {
            lVar15 = 0;
            if (lVar18 != 0) {
              lVar15 = lVar18 + -1;
            }
            sVar12 = sVar12 + lVar15 + 3;
          }
        }
        else {
          if (pSVar5 != (String *)0x0) {
            sVar16 = sVar12 + 2;
          }
          if (DVar21 != LOG) {
            sVar16 = sVar12 + 2;
          }
          if ((uVar17 != 0) && ((char)*plVar1 != '\"')) {
            if (7 < uVar17) goto LAB_0027185b;
LAB_0027186a:
            sVar16 = sVar16 + uVar17 + 3;
          }
LAB_00271871:
          lVar18 = 0;
          if (*plVar10 != 0) {
            lVar18 = *plVar10 + -1;
          }
          sVar12 = lVar18 + sVar16;
        }
        pSVar5 = (String *)((long)&(pSVar5->content).ptr + 1);
        puVar8 = puVar8 + 2;
        plVar10 = plVar10 + 3;
      } while (argValues.ptr != pSVar5);
    }
    pSVar5 = heapString(__return_storage_ptr__,sVar12);
    pcVar19 = (char *)(__return_storage_ptr__->content).size_;
    if (pcVar19 != (char *)0x0) {
      pcVar19 = (__return_storage_ptr__->content).ptr;
    }
    if (DVar21 == ASSERTION) {
      builtin_strncpy(pcVar19,"expected ",9);
      pcVar19 = pcVar19 + 9;
      pSVar5 = (String *)((long)code + local_200 + -1);
      if ((String *)code != pSVar5) {
        pSVar5 = (String *)memcpy(pcVar19,code,local_200 - 1);
        pcVar19 = pcVar19 + local_200 + -1;
      }
    }
    else if (DVar21 == SYSCALL) {
      if ((String *)code != (String *)((long)code + local_200 + -1)) {
        memcpy(pcVar19,code,local_200 - 1);
        pcVar19 = pcVar19 + local_200 + -1;
      }
      pcVar19[0] = ':';
      pcVar19[1] = ' ';
      pcVar19 = pcVar19 + 2;
      pSVar5 = (String *)((long)local_1f8 + local_1f0 + -1);
      if (local_1f8 != pSVar5) {
        pSVar5 = (String *)memcpy(pcVar19,local_1f8,local_1f0 - 1);
        pcVar19 = pcVar19 + local_1f0 + -1;
      }
    }
    if (argValues.ptr != (String *)0x0) {
      puVar8 = (ulong *)(pcVar20 + 8);
      plVar10 = (long *)(macroArgs + 8);
      pSVar13 = (String *)0x0;
      do {
        uVar17 = *puVar8;
        if ((uVar17 == 0xc) &&
           ((int)((long *)puVar8[-1])[1] == 0x6e6f6974 && *(long *)puVar8[-1] == 0x69646e6f436a6b5f)
           ) {
          if ((*plVar10 != 6) ||
             (uVar3 = (ushort)((uint *)plVar10[-1])[1] ^ 0x65 | *(uint *)plVar10[-1] ^ 0x736c6166,
             pSVar5 = (String *)(ulong)uVar3, uVar3 != 0)) {
            pcVar19[0] = ' ';
            pcVar19[1] = '[';
            pcVar19 = pcVar19 + 2;
            pcVar14 = (char *)plVar10[-1];
            pSVar5 = (String *)*plVar10;
            pcVar20 = pcVar14 + -1 + (long)pSVar5;
            if (pSVar5 == (String *)0x0) {
              pcVar20 = (char *)0x0;
              pcVar14 = (char *)0x0;
            }
            if (pcVar14 != pcVar20) {
              pSVar5 = (String *)memcpy(pcVar19,pcVar14,(long)pcVar20 - (long)pcVar14);
              pcVar19 = pcVar19 + ((long)pcVar20 - (long)pcVar14);
            }
            *pcVar19 = ']';
            pcVar19 = pcVar19 + 1;
          }
        }
        else {
          if (DVar21 != LOG || pSVar13 != (String *)0x0) {
            pcVar19[0] = ';';
            pcVar19[1] = ' ';
            pcVar19 = pcVar19 + 2;
            uVar17 = *puVar8;
          }
          if (((uVar17 != 0) && (plVar1 = (long *)puVar8[-1], (char)*plVar1 != '\"')) &&
             ((uVar17 < 8 || (*plVar1 != 0x287274733a3a6a6b)))) {
            memcpy(pcVar19,plVar1,uVar17);
            pcVar20 = pcVar19 + uVar17;
            pcVar19 = pcVar20 + 3;
            pcVar20[0] = ' ';
            pcVar20[1] = '=';
            pcVar20[2] = ' ';
          }
          pcVar14 = (char *)plVar10[-1];
          pSVar5 = (String *)*plVar10;
          pcVar20 = pcVar14 + -1 + (long)pSVar5;
          if (pSVar5 == (String *)0x0) {
            pcVar20 = (char *)0x0;
            pcVar14 = (char *)0x0;
          }
          if (pcVar14 != pcVar20) {
            pSVar5 = (String *)memcpy(pcVar19,pcVar14,(long)pcVar20 - (long)pcVar14);
            pcVar19 = pcVar19 + ((long)pcVar20 - (long)pcVar14);
          }
        }
        pSVar13 = (String *)((long)&(pSVar13->content).ptr + 1);
        puVar8 = puVar8 + 2;
        plVar10 = plVar10 + 3;
      } while (argValues.ptr != pSVar13);
    }
    if (local_1e8 != (char *)0x0) {
      pSVar5 = (String *)(**(code **)*local_1d8)(local_1d8,local_1e8,0x10,pSStack_1e0,pSStack_1e0,0)
      ;
    }
    return pSVar5;
  }
  bVar9 = false;
  pcVar14 = pcVar19;
  pSVar13 = pSVar5;
LAB_0027153b:
  pSVar5 = pSVar13;
  if (bVar9) {
    if (cVar11 != '\"') {
      bVar9 = true;
      if ((cVar11 == '\\') && (*sysErrorString != '\0')) {
        sysErrorString = pcVar14 + 2;
      }
      goto LAB_002715e5;
    }
  }
  else {
    if (cVar11 == '\"') {
      bVar9 = true;
      goto LAB_002715e5;
    }
    if (cVar11 == ')') {
      iVar2 = iVar2 + -1;
    }
    else {
      if (cVar11 == '(') {
        iVar2 = iVar2 + 1;
        goto LAB_002715e3;
      }
      if (iVar2 == 0 && cVar11 == ',') {
        if (pSVar13 < argValues.ptr) {
          pSVar5 = (String *)((long)&(pSVar13->content).ptr + 1);
          *(char **)(pcVar20 + (long)pSVar13 * 0x10) = pcVar19;
          *(long *)(pcVar20 + ((long)pSVar13 * 2 + 1) * 8) = (long)pcVar14 - (long)pcVar19;
        }
        pcVar19 = sysErrorString + -1;
        do {
          cVar11 = pcVar19[1];
          pcVar19 = pcVar19 + 1;
          iVar2 = isspace((int)cVar11);
        } while (iVar2 != 0);
        iVar2 = 0;
        bVar9 = false;
        sysErrorString = pcVar19;
        if (cVar11 != '\0') goto LAB_002715e5;
        goto LAB_002715f8;
      }
    }
  }
LAB_002715e3:
  bVar9 = false;
LAB_002715e5:
  pcVar14 = sysErrorString;
  cVar11 = *pcVar14;
  sysErrorString = pcVar14 + 1;
  pSVar13 = pSVar5;
  if (cVar11 == '\0') goto LAB_002715f8;
  goto LAB_0027153b;
}

Assistant:

static String makeDescriptionImpl(DescriptionStyle style, const char* code, int errorNumber,
                                  const char* sysErrorString, const char* macroArgs,
                                  ArrayPtr<String> argValues) {
  KJ_STACK_ARRAY(ArrayPtr<const char>, argNames, argValues.size(), 8, 64);

  if (argValues.size() > 0) {
    size_t index = 0;
    const char* start = macroArgs;
    while (isspace(*start)) ++start;
    const char* pos = start;
    uint depth = 0;
    bool quoted = false;
    while (char c = *pos++) {
      if (quoted) {
        if (c == '\\' && *pos != '\0') {
          ++pos;
        } else if (c == '\"') {
          quoted = false;
        }
      } else {
        if (c == '(') {
          ++depth;
        } else if (c == ')') {
          --depth;
        } else if (c == '\"') {
          quoted = true;
        } else if (c == ',' && depth == 0) {
          if (index < argValues.size()) {
            argNames[index++] = arrayPtr(start, pos - 1);
          }
          while (isspace(*pos)) ++pos;
          start = pos;
          if (*pos == '\0') {
            // ignore trailing comma
            break;
          }
        }
      }
    }
    if (index < argValues.size()) {
      argNames[index++] = arrayPtr(start, pos - 1);
    }

    if (index != argValues.size()) {
      getExceptionCallback().logMessage(LogSeverity::ERROR, __FILE__, __LINE__, 0,
          str("Failed to parse logging macro args into ",
              argValues.size(), " names: ", macroArgs, '\n'));
    }
  }

  if (style == SYSCALL) {
    // Strip off leading "foo = " from code, since callers will sometimes write things like:
    //   ssize_t n;
    //   RECOVERABLE_SYSCALL(n = read(fd, buffer, sizeof(buffer))) { return ""; }
    //   return std::string(buffer, n);
    const char* equalsPos = strchr(code, '=');
    if (equalsPos != nullptr && equalsPos[1] != '=') {
      code = equalsPos + 1;
      while (isspace(*code)) ++code;
    }
  }

  if (style == ASSERTION && code == nullptr) {
    style = LOG;
  }

  {
    StringPtr expected = "expected ";
    StringPtr codeArray = style == LOG ? nullptr : StringPtr(code);
    StringPtr sep = " = ";
    StringPtr delim = "; ";
    StringPtr colon = ": ";
    StringPtr openBracket = " [";
    StringPtr closeBracket = "]";

    StringPtr sysErrorArray;
// On android before marshmallow only the posix version of stderror_r was
// available, even with __USE_GNU.
#if __USE_GNU && !(defined(__ANDROID_API__) && __ANDROID_API__ < 23)
    char buffer[256]{};
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        sysErrorArray = strerror_r(errorNumber, buffer, sizeof(buffer));
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#else
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        strerror_r(errorNumber, buffer, sizeof(buffer));
        sysErrorArray = buffer;
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#endif

    size_t totalSize = 0;
    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        totalSize += expected.size() + codeArray.size();
        break;
      case SYSCALL:
        totalSize += codeArray.size() + colon.size() + sysErrorArray.size();
        break;
    }

    auto needsLabel = [](const ArrayPtr<const char> &argName) -> bool {
      return argName.size() > 0 && argName[0] != '\"' && !argName.startsWith("kj::str("_kjc);
    };

    for (size_t i = 0; i < argValues.size(); i++) {
      if (argNames[i] == "_kjCondition"_kj) {
        // Special handling: don't output delimiter, we want to append this to the previous item,
        // in brackets. Also, if it's just "[false]" (meaning we didn't manage to extract a
        // comparison), don't add it at all.
        if (argValues[i] != "false") {
          totalSize += openBracket.size() + argValues[i].size() + closeBracket.size();
        }
        continue;
      }

      if (i > 0 || style != LOG) {
        totalSize += delim.size();
      }
      if (needsLabel(argNames[i])) {
        totalSize += argNames[i].size() + sep.size();
      }
      totalSize += argValues[i].size();
    }

    String result = heapString(totalSize);
    char* pos = result.begin();

    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        pos = _::fill(pos, expected, codeArray);
        break;
      case SYSCALL:
        pos = _::fill(pos, codeArray, colon, sysErrorArray);
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (argNames[i] == "_kjCondition"_kj) {
        // Special handling: don't output delimiter, we want to append this to the previous item,
        // in brackets. Also, if it's just "[false]" (meaning we didn't manage to extract a
        // comparison), don't add it at all.
        if (argValues[i] != "false") {
          pos = _::fill(pos, openBracket, argValues[i], closeBracket);
        }
        continue;
      }

      if (i > 0 || style != LOG) {
        pos = _::fill(pos, delim);
      }
      if (needsLabel(argNames[i])) {
        pos = _::fill(pos, argNames[i], sep);
      }
      pos = _::fill(pos, argValues[i]);
    }

    return result;
  }
}